

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

int ON_Font::CompareFontCharacteristicsForExperts
              (bool bComparePlatformSpecificCharacteristics,bool bIgnoreUnsetCharacteristics,
              ON_Font *lhs,ON_Font *rhs)

{
  Weight font_weight;
  bool bVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  double local_d0;
  double local_c8;
  bool local_ba;
  bool local_b8;
  bool local_b6;
  bool local_9f;
  bool local_9d;
  bool local_83;
  bool local_81;
  double rhs_point_size;
  double lhs_point_size;
  bool bCompareStretch;
  Stretch rhs_stretch;
  Stretch lhs_stretch;
  bool bCompareStyle;
  Style rhs_style;
  Style lhs_style;
  bool bCompareWeight;
  Weight rhs_weight;
  Weight lhs_weight;
  bool bCompareWindowsLogfontName;
  ON_wString rhs_logfont_name;
  ON_wString lhs_logfont_name;
  bool bCompareFamilyName;
  undefined1 local_38 [8];
  ON_wString rhs_family_name;
  ON_wString lhs_family_name;
  int j;
  int i;
  ON_Font *rhs_local;
  ON_Font *lhs_local;
  bool bIgnoreUnsetCharacteristics_local;
  bool bComparePlatformSpecificCharacteristics_local;
  
  FamilyName((ON_Font *)&rhs_family_name);
  FamilyName((ON_Font *)local_38);
  local_81 = true;
  if (bIgnoreUnsetCharacteristics) {
    bVar1 = ON_wString::IsNotEmpty(&rhs_family_name);
    local_83 = false;
    if (bVar1) {
      local_83 = ON_wString::IsNotEmpty((ON_wString *)local_38);
    }
    local_81 = local_83;
  }
  if (local_81 != false) {
    pwVar2 = ON_wString::operator_cast_to_wchar_t_(&rhs_family_name);
    pwVar3 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_38);
    lhs_family_name.m_s._4_4_ = ON_wString::CompareOrdinal(pwVar2,pwVar3,true);
    lhs_family_name.m_s._0_4_ = 0;
    if (lhs_family_name.m_s._4_4_ != 0) goto LAB_0063cd8f;
  }
  WindowsLogfontName((ON_Font *)&rhs_logfont_name);
  WindowsLogfontName((ON_Font *)&lhs_stretch);
  local_9d = true;
  if (bIgnoreUnsetCharacteristics) {
    bVar1 = ON_wString::IsNotEmpty(&rhs_logfont_name);
    local_9f = false;
    if (bVar1) {
      local_9f = ON_wString::IsNotEmpty((ON_wString *)&lhs_stretch);
    }
    local_9d = local_9f;
  }
  if (local_9d == false) {
LAB_0063ca57:
    font_weight = rhs->m_font_weight;
    local_b6 = true;
    if (bIgnoreUnsetCharacteristics) {
      local_b6 = lhs->m_font_weight != Unset && font_weight != Unset;
    }
    if (local_b6) {
      lhs_family_name.m_s._4_4_ = WindowsLogfontWeightFromWeight(lhs->m_font_weight);
      lhs_family_name.m_s._0_4_ = WindowsLogfontWeightFromWeight(font_weight);
      if (lhs_family_name.m_s._4_4_ != (uint)lhs_family_name.m_s) goto LAB_0063cd70;
    }
    local_b8 = true;
    if (bIgnoreUnsetCharacteristics) {
      local_b8 = lhs->m_font_style != Unset && rhs->m_font_style != Unset;
    }
    if (local_b8) {
      lhs_family_name.m_s._4_4_ = (uint)lhs->m_font_style;
      lhs_family_name.m_s._0_4_ = (uint)rhs->m_font_style;
      if (lhs_family_name.m_s._4_4_ != (uint)lhs_family_name.m_s) goto LAB_0063cd70;
    }
    local_ba = true;
    if (bIgnoreUnsetCharacteristics) {
      local_ba = lhs->m_font_stretch != Unset && rhs->m_font_stretch != Unset;
    }
    if (local_ba) {
      lhs_family_name.m_s._4_4_ = (uint)lhs->m_font_stretch;
      lhs_family_name.m_s._0_4_ = (uint)rhs->m_font_stretch;
      if (lhs_family_name.m_s._4_4_ != (uint)lhs_family_name.m_s) goto LAB_0063cd70;
    }
    lhs_family_name.m_s._4_4_ = (uint)((lhs->m_font_bUnderlined & 1U) != 0);
    lhs_family_name.m_s._0_4_ = (uint)((rhs->m_font_bUnderlined & 1U) != 0);
    if (lhs_family_name.m_s._4_4_ == (uint)lhs_family_name.m_s) {
      lhs_family_name.m_s._4_4_ = (uint)((lhs->m_font_bStrikethrough & 1U) != 0);
      lhs_family_name.m_s._0_4_ = (uint)((rhs->m_font_bStrikethrough & 1U) != 0);
      if (lhs_family_name.m_s._4_4_ == (uint)lhs_family_name.m_s) {
        bVar1 = IsValidPointSize(lhs->m_point_size);
        if (bVar1) {
          local_c8 = lhs->m_point_size;
        }
        else {
          local_c8 = 0.0;
        }
        bVar1 = IsValidPointSize(rhs->m_point_size);
        if (bVar1) {
          local_d0 = rhs->m_point_size;
        }
        else {
          local_d0 = 0.0;
        }
        lhs_family_name.m_s._0_4_ = 0;
        if (local_d0 <= local_c8) {
          lhs_family_name.m_s._5_3_ = 0;
          lhs_family_name.m_s._4_1_ = local_d0 < local_c8;
        }
        else {
          lhs_family_name.m_s._4_4_ = 0xffffffff;
        }
      }
    }
  }
  else {
    pwVar2 = ON_wString::operator_cast_to_wchar_t_(&rhs_logfont_name);
    pwVar3 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&lhs_stretch);
    lhs_family_name.m_s._4_4_ = ON_wString::CompareOrdinal(pwVar2,pwVar3,true);
    lhs_family_name.m_s._0_4_ = 0;
    if (lhs_family_name.m_s._4_4_ == 0) goto LAB_0063ca57;
  }
LAB_0063cd70:
  ON_wString::~ON_wString((ON_wString *)&lhs_stretch);
  ON_wString::~ON_wString(&rhs_logfont_name);
LAB_0063cd8f:
  ON_wString::~ON_wString((ON_wString *)local_38);
  ON_wString::~ON_wString(&rhs_family_name);
  if ((int)lhs_family_name.m_s._4_4_ < (int)(uint)lhs_family_name.m_s) {
    lhs_local._4_4_ = -1;
  }
  else if ((int)(uint)lhs_family_name.m_s < (int)lhs_family_name.m_s._4_4_) {
    lhs_local._4_4_ = 1;
  }
  else {
    lhs_local._4_4_ = 0;
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_Font::CompareFontCharacteristicsForExperts(
  bool bComparePlatformSpecificCharacteristics,
  bool bIgnoreUnsetCharacteristics,
  const ON_Font& lhs,
  const ON_Font& rhs
)
{
  int i = 0;
  int j = 0;

  for (;;)
  {
    const ON_wString lhs_family_name = lhs.FamilyName();
    const ON_wString rhs_family_name = rhs.FamilyName();
    const bool bCompareFamilyName =
      false == bIgnoreUnsetCharacteristics
      || (0 != lhs_family_name.IsNotEmpty() && 0 != rhs_family_name.IsNotEmpty());
    if (bCompareFamilyName)
    {
      i = ON_wString::CompareOrdinal(lhs_family_name, rhs_family_name, true);
      j = 0;
      if ( i != j )
        break;
    }

    const ON_wString lhs_logfont_name = lhs.WindowsLogfontName();
    const ON_wString rhs_logfont_name = rhs.WindowsLogfontName();
    const bool bCompareWindowsLogfontName =
      false == bIgnoreUnsetCharacteristics
      || (lhs_logfont_name.IsNotEmpty() && rhs_logfont_name.IsNotEmpty());
    if (bCompareWindowsLogfontName)
    {
      i = ON_wString::CompareOrdinal(lhs_logfont_name, rhs_logfont_name, true);
      j = 0;
      if ( i != j )
        break;
    }

    const ON_Font::Weight lhs_weight = lhs.m_font_weight;
    const ON_Font::Weight rhs_weight = rhs.m_font_weight;
    const bool bCompareWeight =
      false == bIgnoreUnsetCharacteristics
      || (ON_Font::Weight::Unset != lhs_weight && ON_Font::Weight::Unset != rhs_weight);
    if (bCompareWeight)
    {
      i = ON_Font::WindowsLogfontWeightFromWeight(lhs_weight);
      j = ON_Font::WindowsLogfontWeightFromWeight(rhs_weight);
      if (i != j)
        break;
    }

    const ON_Font::Style lhs_style = lhs.m_font_style;
    const ON_Font::Style rhs_style = rhs.m_font_style;
    const bool bCompareStyle =
      false == bIgnoreUnsetCharacteristics
      || (ON_Font::Style::Unset != lhs_style && ON_Font::Style::Unset != rhs_style);
    if (bCompareStyle)
    {
      i = static_cast<int>(lhs_style);
      j = static_cast<int>(rhs_style);
      if (i != j)
        break;
    }

    const ON_Font::Stretch lhs_stretch = lhs.m_font_stretch;
    const ON_Font::Stretch rhs_stretch = rhs.m_font_stretch;
    const bool bCompareStretch =
      false == bIgnoreUnsetCharacteristics
      || (ON_Font::Stretch::Unset != lhs_stretch && ON_Font::Stretch::Unset != rhs_stretch);
    if (bCompareStretch)
    {
      i = static_cast<int>(lhs_stretch);
      j = static_cast<int>(rhs_stretch);
      if (i != j)
        break;
    }

    i = lhs.m_font_bUnderlined ? 1 : 0;
    j = rhs.m_font_bUnderlined ? 1 : 0;
    if ( i != j )
      break;

    i = lhs.m_font_bStrikethrough ? 1 : 0;
    j = rhs.m_font_bStrikethrough ? 1 : 0;
    if ( i != j )
      break;

    const double lhs_point_size = ON_Font::IsValidPointSize(lhs.m_point_size) ? lhs.m_point_size : 0.0;
    const double rhs_point_size = ON_Font::IsValidPointSize(rhs.m_point_size) ? rhs.m_point_size : 0.0;
    j = 0;
    if (lhs_point_size < rhs_point_size)
      i = -1;
    else if (rhs_point_size < lhs_point_size)
      i = 1;
    else
      i = 0;
    if (i != j)
      break;
 
    if (false == bComparePlatformSpecificCharacteristics)
      break;
 
#if defined(ON_RUNTIME_WIN) 
    i = (ON_Font::WindowsConstants::logfont_symbol_charset == lhs.m_logfont_charset) ? 1 : 0;
    j = (ON_Font::WindowsConstants::logfont_symbol_charset == rhs.m_logfont_charset) ? 1 : 0;
    if ( i != j )
      break;
#endif


#if defined(ON_RUNTIME_APPLE)     
  const ON_wString lhs_postscript_name = lhs.PostScriptName();
  const ON_wString rhs_postscript_name = rhs.PostScriptName();
    const bool bComparePostScriptName =
      false == bIgnoreUnsetCharacteristics
      || (lhs_postscript_name.IsNotEmpty() && rhs_postscript_name.IsNotEmpty());
    if (bComparePostScriptName)
    {
      i = ON_wString::CompareOrdinal(lhs_postscript_name, rhs_postscript_name, false);
      if (0 == i)
      {
        if (lhs.m_apple_font_weight_trait < rhs.m_apple_font_weight_trait)
          i = -1;
        else if (lhs.m_apple_font_weight_trait > rhs.m_apple_font_weight_trait)
          i = 1;
      }
      j = 0;
      if (i != j)
        break;
    }
#endif

    break;
  }

  if (i < j)
    return -1;
  if (i > j)
    return 1;

  return 0;
}